

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_validator_factory_201909.hpp
# Opt level: O3

void __thiscall
jsoncons::jsonschema::draft201909::
schema_validator_factory_201909<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
::schema_validator_factory_201909
          (schema_validator_factory_201909<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           *this,basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *sch,
          validator_factory_factory_type *factory_factory,evaluation_options *options,
          schema_store_type *schema_store_ptr,
          vector<std::function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_(const_jsoncons::uri_&)>,_std::allocator<std::function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_(const_jsoncons::uri_&)>_>_>
          *resolve_funcs,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          *vocabulary)

{
  const_iterator cVar1;
  string *psVar2;
  string local_a0;
  evaluation_options local_80;
  
  schema_version::draft201909_abi_cxx11_();
  evaluation_options::evaluation_options(&local_80,options);
  psVar2 = &local_a0;
  schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  ::schema_validator_factory_base
            (&this->
              super_schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
             ,psVar2,sch,factory_factory,&local_80,schema_store_ptr,resolve_funcs,vocabulary);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.default_base_uri_._M_dataplus._M_p != &local_80.default_base_uri_.field_2) {
    psVar2 = (string *)(local_80.default_base_uri_.field_2._M_allocated_capacity + 1);
    operator_delete(local_80.default_base_uri_._M_dataplus._M_p,(ulong)psVar2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.default_version_._M_dataplus._M_p != &local_80.default_version_.field_2) {
    psVar2 = (string *)(local_80.default_version_.field_2._M_allocated_capacity + 1);
    operator_delete(local_80.default_version_._M_dataplus._M_p,(ulong)psVar2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    psVar2 = (string *)(local_a0.field_2._M_allocated_capacity + 1);
    operator_delete(local_a0._M_dataplus._M_p,(ulong)psVar2);
  }
  (this->
  super_schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  )._vptr_schema_validator_factory_base =
       (_func_int **)&PTR__schema_validator_factory_201909_00b45440;
  (this->validation_factory_map_)._M_h._M_buckets =
       &(this->validation_factory_map_)._M_h._M_single_bucket;
  (this->validation_factory_map_)._M_h._M_bucket_count = 1;
  (this->validation_factory_map_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->validation_factory_map_)._M_h._M_element_count = 0;
  (this->validation_factory_map_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->validation_factory_map_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->validation_factory_map_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->include_applicator_ = true;
  this->include_unevaluated_ = true;
  this->include_validation_ = true;
  this->include_format_ = true;
  (this->factory_).factory_ =
       &this->
        super_schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  ;
  if ((vocabulary->_M_h)._M_element_count != 0) {
    psVar2 = schema_validator_factory_201909<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
             ::applicator_id_abi_cxx11_();
    cVar1 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&vocabulary->_M_h,psVar2);
    if ((cVar1.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_true>
         ._M_cur == (__node_type *)0x0) ||
       (*(char *)((long)cVar1.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_true>
                        ._M_cur + 0x28) == '\0')) {
      this->include_applicator_ = false;
    }
    psVar2 = schema_validator_factory_201909<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
             ::unevaluated_id_abi_cxx11_();
    cVar1 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&vocabulary->_M_h,psVar2);
    if ((cVar1.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_true>
         ._M_cur == (__node_type *)0x0) ||
       (*(char *)((long)cVar1.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_true>
                        ._M_cur + 0x28) == '\0')) {
      this->include_unevaluated_ = false;
    }
    psVar2 = schema_validator_factory_201909<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
             ::validation_id_abi_cxx11_();
    cVar1 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&vocabulary->_M_h,psVar2);
    if ((cVar1.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_true>
         ._M_cur == (__node_type *)0x0) ||
       (*(char *)((long)cVar1.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_true>
                        ._M_cur + 0x28) == '\0')) {
      this->include_validation_ = false;
    }
    psVar2 = schema_validator_factory_201909<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
             ::format_annotation_id_abi_cxx11_();
    cVar1 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&vocabulary->_M_h,psVar2);
    if ((cVar1.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_true>
         ._M_cur == (__node_type *)0x0) ||
       (*(char *)((long)cVar1.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_true>
                        ._M_cur + 0x28) == '\0')) {
      this->include_format_ = false;
    }
  }
  init(this,(EVP_PKEY_CTX *)psVar2);
  return;
}

Assistant:

schema_validator_factory_201909(Json&& sch, const validator_factory_factory_type& factory_factory, 
            evaluation_options options, schema_store_type* schema_store_ptr,
            const std::vector<resolve_uri_type<Json>>& resolve_funcs,
            const std::unordered_map<std::string,bool>& vocabulary) noexcept
            : schema_validator_factory_base<Json>(schema_version::draft201909(), 
                std::move(sch), factory_factory, options, schema_store_ptr, resolve_funcs, vocabulary),
              factory_(this) 
        {
            if (!vocabulary.empty())
            {
                auto it = vocabulary.find(applicator_id());
                if (it == vocabulary.end() || !((*it).second))
                {
                    include_applicator_ = false;
                }
                it = vocabulary.find(unevaluated_id());
                if (it == vocabulary.end() || !((*it).second))
                {
                    include_unevaluated_ = false;
                }
                it = vocabulary.find(validation_id());
                if (it == vocabulary.end() || !((*it).second))
                {
                    include_validation_ = false;
                }
                it = vocabulary.find(format_annotation_id());
                if (it == vocabulary.end() || !((*it).second))
                {
                    include_format_ = false;
                }
            }
            init();
        }